

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBox.h
# Opt level: O3

int __thiscall CBBox::IsInside(CBBox *this,CBBox *pBBox)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((((this->m_iMinX <= pBBox->m_iMinX) && (this->m_iMinY <= pBBox->m_iMinY)) &&
      (this->m_cMinZ <= pBBox->m_cMinZ)) &&
     ((pBBox->m_iMaxX <= this->m_iMaxX && (pBBox->m_iMaxY <= this->m_iMaxY)))) {
    uVar1 = (uint)(pBBox->m_cMaxZ <= this->m_cMaxZ);
  }
  return uVar1;
}

Assistant:

inline int CBBox::Y()	{	return	m_iMinY;}